

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

void __thiscall Dashel::Stream::fail(Stream *this,Source s,int se,char *reason)

{
  string *psVar1;
  int *piVar2;
  DashelException *this_00;
  string sysMessage;
  
  sysMessage._M_dataplus._M_p = (pointer)&sysMessage.field_2;
  sysMessage._M_string_length = 0;
  sysMessage.field_2._M_local_buf[0] = '\0';
  this->failedFlag = true;
  if (se != 0) {
    piVar2 = __errno_location();
    strerror(*piVar2);
    std::__cxx11::string::assign((char *)&sysMessage);
  }
  psVar1 = &this->failReason;
  std::__cxx11::string::assign((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((string *)psVar1);
  this_00 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException(this_00,s,se,(this->failReason)._M_dataplus._M_p,this);
  __cxa_throw(this_00,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Stream::fail(DashelException::Source s, int se, const char* reason)
	{
		string sysMessage;
		failedFlag = true;

		if (se)
			sysMessage = strerror(errno);

		failReason = reason;
		failReason += " ";
		failReason += sysMessage;

		throw DashelException(s, se, failReason.c_str(), this);
	}